

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VTuneChakraProfile.cpp
# Opt level: O2

void VTuneChakraProfile::LogLoopBodyLoadEvent
               (FunctionBody *body,LoopEntryPointInfo *entryPoint,uint16 loopNumber)

{
  uint32 uVar1;
  uint uVar2;
  char16 *string;
  size_t sVar3;
  HeapAllocator *this;
  utf8char_t *dest;
  utf8char_t *buffer;
  ulong byteSize;
  undefined1 local_b0 [8];
  TrackAllocData data;
  
  if (isJitProfilingActive) {
    data.line = 0;
    data._36_4_ = 0;
    string = Js::ParseableFunctionInfo::GetExternalDisplayName(&body->super_ParseableFunctionInfo);
    sVar3 = PAL_wcslen(string);
    uVar1 = UInt32Math::MulAdd<3u,18u>((uint32)sVar3);
    byteSize = (ulong)uVar1;
    local_b0 = (undefined1  [8])&unsigned_char::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_31dec53;
    data.filename._0_4_ = 0x85;
    data.plusSize = byteSize;
    this = Memory::HeapAllocator::TrackAllocInfo
                     (&Memory::HeapAllocator::Instance,(TrackAllocData *)local_b0);
    dest = (utf8char_t *)Memory::HeapAllocator::AllocT<true>(this,byteSize);
    if (dest != (utf8char_t *)0x0) {
      uVar2 = iJIT_GetNewMethodID();
      data.line = uVar2;
      sVar3 = utf8::EncodeInto<(utf8::Utf8EncodingKind)0>(dest,byteSize,string,(uint32)sVar3);
      sprintf_s((char *)(dest + sVar3),byteSize - sVar3," %s %d","Loop",(ulong)(loopNumber + 1));
      Js::EntryPointInfo::GetNativeAddress(&entryPoint->super_EntryPointInfo);
      Js::EntryPointInfo::GetCodeSize(&entryPoint->super_EntryPointInfo);
      local_b0 = (undefined1  [8])0x0;
      buffer = GetUrl(body,(size_t *)local_b0);
      iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED,&data.line);
      Output::Trace(ProfilerPhase,L"Loop body load event: %s Loop %d\n",string,
                    (ulong)(loopNumber + 1));
      if (local_b0 != (undefined1  [8])0x0) {
        Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,buffer,(size_t)local_b0);
      }
      Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,dest,byteSize);
    }
  }
  return;
}

Assistant:

void VTuneChakraProfile::LogLoopBodyLoadEvent(Js::FunctionBody* body, Js::LoopEntryPointInfo* entryPoint, uint16 loopNumber)
{
#if ENABLE_NATIVE_CODEGEN
    if (isJitProfilingActive)
    {
        iJIT_Method_Load methodInfo;
        memset(&methodInfo, 0, sizeof(iJIT_Method_Load));
        const char16* methodName = body->GetExternalDisplayName();
        size_t methodLength = wcslen(methodName);
        charcount_t ccMethodLength = static_cast<charcount_t>(methodLength);
        ccMethodLength = min(ccMethodLength, UINT_MAX); // Just truncate if it is too big
        constexpr size_t sizeToAdd = /* spaces */ 2 + _countof(LoopStr) + /* size of loop number */ 10 + /*NULL*/ 1;
        size_t cbUtf8MethodName = UInt32Math::MulAdd<3, sizeToAdd>(ccMethodLength);
        utf8char_t* utf8MethodName = HeapNewNoThrowArray(utf8char_t, cbUtf8MethodName);
        if(utf8MethodName)
        {
            methodInfo.method_id = iJIT_GetNewMethodID();
            size_t len = utf8::EncodeInto<utf8::Utf8EncodingKind::Cesu8>(utf8MethodName, cbUtf8MethodName, methodName, ccMethodLength);
            sprintf_s((char*)(utf8MethodName + len), cbUtf8MethodName - len," %s %d", LoopStr, loopNumber + 1);
            methodInfo.method_name = (char*)utf8MethodName;
            methodInfo.method_load_address = (void*)entryPoint->GetNativeAddress();
            methodInfo.method_size = (uint)entryPoint->GetCodeSize();        // Size in memory - Must be exact

            size_t urlLength  = 0;
            utf8char_t* utf8Url = GetUrl(body, &urlLength);
            methodInfo.source_file_name = (char*)utf8Url;

            iJIT_NotifyEvent(iJVM_EVENT_TYPE_METHOD_LOAD_FINISHED, &methodInfo);
            OUTPUT_TRACE(Js::ProfilerPhase, _u("Loop body load event: %s Loop %d\n"), methodName, loopNumber + 1);

            if(urlLength > 0)
            {
                HeapDeleteArray(urlLength, utf8Url);
            }
            HeapDeleteArray(cbUtf8MethodName, utf8MethodName);
        }
    }
#endif
}